

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool IsFileInDir(string *infile,string *indir)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_60 [8];
  string dir;
  string file;
  string *indir_local;
  string *infile_local;
  
  cmsys::SystemTools::CollapseFullPath((string *)((long)&dir.field_2 + 8),infile);
  cmsys::SystemTools::CollapseFullPath((string *)local_60,indir);
  uVar3 = std::__cxx11::string::size();
  uVar4 = std::__cxx11::string::size();
  bVar1 = false;
  bVar6 = false;
  if (uVar4 < uVar3) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_90,(ulong)((long)&dir.field_2 + 8));
    bVar1 = true;
    _Var2 = std::operator==(&local_90,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60);
    bVar6 = false;
    if (_Var2) {
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)((long)&dir.field_2 + 8));
      bVar6 = *pcVar5 == '/';
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
  return bVar6;
}

Assistant:

bool IsFileInDir(const std::string &infile, const std::string &indir)
{
  std::string file = cmSystemTools::CollapseFullPath(infile);
  std::string dir = cmSystemTools::CollapseFullPath(indir);

  if (
    file.size() > dir.size() &&
    (fnc(file.substr(0, dir.size())) == fnc(dir)) &&
    file[dir.size()] == '/'
    )
    {
    return true;
    }

  return false;
}